

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

Spline * createLandSpline(SplineStack *ss,float f,float g,float h,float i,float j,float k,int bl)

{
  Spline *pSVar1;
  float *pfVar2;
  Spline *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Spline *pSVar7;
  Spline *pSVar8;
  Spline *pSVar9;
  Spline *pSVar10;
  Spline *pSVar11;
  Spline *pSVar12;
  Spline *pSVar13;
  Spline *pSVar14;
  float g_00;
  
  pSVar7 = createSpline_38219(ss,i * 0.9 + 0.6,bl);
  pSVar8 = createSpline_38219(ss,i * 0.39999998 + 0.6,bl);
  pSVar9 = createSpline_38219(ss,i,bl);
  g_00 = i * 0.5;
  pSVar10 = createFlatOffsetSpline(ss,f + -0.15,g_00,g_00,g_00,i * 0.6,0.5);
  pSVar11 = createFlatOffsetSpline(ss,f,i * j,g * i,g_00,i * 0.6,0.5);
  pSVar12 = createFlatOffsetSpline(ss,f,j,j,g,h,0.5);
  pSVar13 = createFlatOffsetSpline(ss,f,j,j,g,h,0.5);
  iVar4 = ss->len;
  ss->len = iVar4 + 1;
  pSVar1 = ss->stack + iVar4;
  ss->stack[iVar4].typ = 2;
  iVar5 = ss->flen;
  ss->flen = iVar5 + 1;
  pSVar3 = (Spline *)(ss->fstack + iVar5);
  pSVar3->len = 1;
  pSVar3->typ = (int)f;
  iVar6 = ss->stack[iVar4].len;
  pSVar1->val[iVar6] = pSVar3;
  ss->stack[iVar4].len = iVar6 + 1;
  (pSVar1->loc + iVar6)[0] = -1.0;
  (pSVar1->loc + iVar6)[1] = -0.4;
  pSVar1->val[(long)iVar6 + 1] = pSVar12;
  (pSVar1->der + iVar6)[0] = 0.0;
  (pSVar1->der + iVar6)[1] = 0.0;
  ss->stack[iVar4].len = iVar6 + 2;
  ss->flen = iVar5 + 2;
  ((Spline *)(ss->fstack + (long)iVar5 + 1))->len = 1;
  ss->fstack[(long)iVar5 + 1].val = h + 0.07;
  pSVar1->loc[(long)iVar6 + 2] = 0.0;
  pSVar1->val[(long)iVar6 + 2] = (Spline *)(ss->fstack + (long)iVar5 + 1);
  pSVar1->der[(long)iVar6 + 2] = 0.0;
  ss->stack[iVar4].len = iVar6 + 3;
  pSVar14 = createFlatOffsetSpline(ss,-0.02,k,k,g,h,0.0);
  iVar4 = ss->len;
  ss->len = iVar4 + 1;
  pSVar3 = ss->stack + iVar4;
  ss->stack[iVar4].typ = 1;
  iVar5 = ss->stack[iVar4].len;
  pSVar3->val[iVar5] = pSVar7;
  ss->stack[iVar4].len = iVar5 + 1;
  pSVar3->val[(long)iVar5 + 1] = pSVar8;
  ss->stack[iVar4].len = iVar5 + 2;
  pSVar3->val[(long)iVar5 + 2] = pSVar9;
  ss->stack[iVar4].len = iVar5 + 3;
  pfVar2 = pSVar3->loc + iVar5;
  pfVar2[0] = -0.85;
  pfVar2[1] = -0.7;
  pfVar2[2] = -0.4;
  pfVar2[3] = -0.35;
  pSVar3->val[(long)iVar5 + 3] = pSVar10;
  pfVar2 = pSVar3->der + iVar5;
  pfVar2[0] = 0.0;
  pfVar2[1] = 0.0;
  pfVar2[2] = 0.0;
  pfVar2[3] = 0.0;
  ss->stack[iVar4].len = iVar5 + 4;
  pSVar3->loc[(long)iVar5 + 4] = -0.1;
  pSVar3->val[(long)iVar5 + 4] = pSVar11;
  pSVar3->der[(long)iVar5 + 4] = 0.0;
  ss->stack[iVar4].len = iVar5 + 5;
  pSVar3->loc[(long)iVar5 + 5] = 0.2;
  pSVar3->val[(long)iVar5 + 5] = pSVar12;
  pSVar3->der[(long)iVar5 + 5] = 0.0;
  ss->stack[iVar4].len = iVar5 + 6;
  if (bl != 0) {
    pSVar3->loc[(long)iVar5 + 6] = 0.4;
    pSVar3->val[(long)iVar5 + 6] = pSVar13;
    pSVar3->der[(long)iVar5 + 6] = 0.0;
    pSVar3->len = iVar5 + 7;
    pSVar3->loc[(long)iVar5 + 7] = 0.45;
    pSVar3->val[(long)iVar5 + 7] = pSVar1;
    pSVar3->der[(long)iVar5 + 7] = 0.0;
    pSVar3->len = iVar5 + 8;
    pSVar3->loc[(long)iVar5 + 8] = 0.55;
    pSVar3->val[(long)iVar5 + 8] = pSVar1;
    pSVar3->der[(long)iVar5 + 8] = 0.0;
    pSVar3->len = iVar5 + 9;
    pSVar3->loc[(long)iVar5 + 9] = 0.58;
    pSVar3->val[(long)iVar5 + 9] = pSVar13;
    pSVar3->der[(long)iVar5 + 9] = 0.0;
    pSVar3->len = iVar5 + 10;
  }
  iVar4 = pSVar3->len;
  pSVar3->loc[iVar4] = 0.7;
  pSVar3->val[iVar4] = pSVar14;
  pSVar3->der[iVar4] = 0.0;
  pSVar3->len = iVar4 + 1;
  return pSVar3;
}

Assistant:

static Spline *createLandSpline(
    SplineStack *ss, float f, float g, float h, float i, float j, float k, int bl)
{
    Spline *sp1 = createSpline_38219(ss, lerp(i, 0.6F, 1.5F), bl);
    Spline *sp2 = createSpline_38219(ss, lerp(i, 0.6F, 1.0F), bl);
    Spline *sp3 = createSpline_38219(ss, i, bl);
    const float ih = 0.5F * i;
    Spline *sp4 = createFlatOffsetSpline(ss, f-0.15F, ih, ih, ih, i*0.6F, 0.5F);
    Spline *sp5 = createFlatOffsetSpline(ss, f, j*i, g*i, ih, i*0.6F, 0.5F);
    Spline *sp6 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);
    Spline *sp7 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);

    Spline *sp8 = &ss->stack[ss->len++];
    sp8->typ = SP_RIDGES;
    addSplineVal(sp8, -1.0F, createFixSpline(ss, f), 0.0F);
    addSplineVal(sp8, -0.4F, sp6, 0.0F);
    addSplineVal(sp8,  0.0F, createFixSpline(ss, h + 0.07F), 0.0F);

    Spline *sp9 = createFlatOffsetSpline(ss, -0.02F, k, k, g, h, 0.0F);
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_EROSION;
    addSplineVal(sp, -0.85F, sp1, 0.0F);
    addSplineVal(sp, -0.7F,  sp2, 0.0F);
    addSplineVal(sp, -0.4F,  sp3, 0.0F);
    addSplineVal(sp, -0.35F, sp4, 0.0F);
    addSplineVal(sp, -0.1F,  sp5, 0.0F);
    addSplineVal(sp,  0.2F,  sp6, 0.0F);
    if (bl) {
        addSplineVal(sp, 0.4F,  sp7, 0.0F);
        addSplineVal(sp, 0.45F, sp8, 0.0F);
        addSplineVal(sp, 0.55F, sp8, 0.0F);
        addSplineVal(sp, 0.58F, sp7, 0.0F);
    }
    addSplineVal(sp, 0.7F, sp9, 0.0F);
    return sp;
}